

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

void cppcms::json::anon_unknown_9::indent(ostream *out,char c,int *tabs)

{
  ostream *poVar1;
  int iVar2;
  char local_34 [5];
  char local_2f [3];
  char local_2c [3];
  char local_29;
  
  if (*tabs < 0) {
    local_34[4] = c;
    std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 4,1);
    return;
  }
  if (c < ']') {
    if (c == ',') {
      local_2f[2] = c;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2f + 2,1);
      local_2c[0] = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2c,1);
      if (*tabs < 1) {
        return;
      }
      iVar2 = *tabs + 1;
      do {
        local_34[1] = 9;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 1,1);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
      return;
    }
    if (c == ':') {
      std::__ostream_insert<char,std::char_traits<char>>(out," :\t",3);
      return;
    }
    if (c != '[') {
      return;
    }
  }
  else {
    if ((c == ']') || (c == '}')) {
      local_2c[1] = 10;
      std::__ostream_insert<char,std::char_traits<char>>(out,local_2c + 1,1);
      iVar2 = *tabs;
      *tabs = iVar2 + -1;
      if (1 < iVar2) {
        do {
          local_34[2] = 9;
          std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 2,1);
          iVar2 = iVar2 + -1;
        } while (1 < iVar2);
      }
      local_2c[2] = c;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2c + 2,1);
      local_29 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_29,1);
      if (*tabs < 1) {
        return;
      }
      iVar2 = *tabs + 1;
      do {
        local_34[3] = 9;
        std::__ostream_insert<char,std::char_traits<char>>(out,local_34 + 3,1);
        iVar2 = iVar2 + -1;
      } while (1 < iVar2);
      return;
    }
    if (c != '{') {
      return;
    }
  }
  local_2f[0] = c;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(out,local_2f,1);
  local_2f[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2f + 1,1);
  iVar2 = *tabs;
  *tabs = iVar2 + 1;
  if (-1 < iVar2) {
    iVar2 = iVar2 + 2;
    do {
      local_34[0] = '\t';
      std::__ostream_insert<char,std::char_traits<char>>(out,local_34,1);
      iVar2 = iVar2 + -1;
    } while (1 < iVar2);
  }
  return;
}

Assistant:

void indent(std::ostream &out,char c,int &tabs)
		{
			if(tabs < 0) {
				out<<c;
				return;
			}
			switch(c) {
			case '{':
			case '[':
				out<<c<<'\n';
				tabs++;
				pad(out,tabs);
				break;
			case ',':
				out<<c<<'\n';
				pad(out,tabs);
				break;
			case ':':
				out<<" :\t";
				break;
			case '}':
			case ']':
				out<<'\n';
				tabs--;
				pad(out,tabs);
				out<<c<<'\n';
				pad(out,tabs);
				break;
			}
		}